

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptor::CopyJsonNameTo(FileDescriptor *this,FileDescriptorProto *proto)

{
  int iVar1;
  int iVar2;
  LogMessage *pLVar3;
  Descriptor *this_00;
  DescriptorProto *proto_00;
  FieldDescriptor *this_01;
  FieldDescriptorProto *proto_01;
  int local_4c;
  int local_48;
  int i_1;
  int i;
  LogMessage local_30;
  Voidify local_19;
  FileDescriptorProto *local_18;
  FileDescriptorProto *proto_local;
  FileDescriptor *this_local;
  
  local_18 = proto;
  proto_local = (FileDescriptorProto *)this;
  iVar1 = message_type_count(this);
  iVar2 = FileDescriptorProto::message_type_size(local_18);
  if (iVar1 == iVar2) {
    iVar1 = extension_count(this);
    iVar2 = FileDescriptorProto::extension_size(local_18);
    if (iVar1 == iVar2) {
      for (local_48 = 0; iVar1 = message_type_count(this), local_48 < iVar1; local_48 = local_48 + 1
          ) {
        this_00 = message_type(this,local_48);
        proto_00 = FileDescriptorProto::mutable_message_type(local_18,local_48);
        Descriptor::CopyJsonNameTo(this_00,proto_00);
      }
      for (local_4c = 0; iVar1 = extension_count(this), local_4c < iVar1; local_4c = local_4c + 1) {
        this_01 = extension(this,local_4c);
        proto_01 = FileDescriptorProto::mutable_extension(local_18,local_4c);
        FieldDescriptor::CopyJsonNameTo(this_01,proto_01);
      }
      return;
    }
  }
  absl::lts_20250127::log_internal::LogMessage::LogMessage
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,0xc72);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar3,(char (*) [54])"Cannot copy json_name to a proto of a different size.")
  ;
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar3);
  absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_30);
  return;
}

Assistant:

void FileDescriptor::CopyJsonNameTo(FileDescriptorProto* proto) const {
  if (message_type_count() != proto->message_type_size() ||
      extension_count() != proto->extension_size()) {
    ABSL_LOG(ERROR) << "Cannot copy json_name to a proto of a different size.";
    return;
  }
  for (int i = 0; i < message_type_count(); i++) {
    message_type(i)->CopyJsonNameTo(proto->mutable_message_type(i));
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyJsonNameTo(proto->mutable_extension(i));
  }
}